

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::VaryingComponentWithoutLocationTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingComponentWithoutLocationTest *this,
          GLuint test_case_index)

{
  pointer ptVar1;
  GLchar *pGVar2;
  size_t sVar3;
  char *pcVar4;
  stringstream stream;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentWithoutLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentWithoutLocationTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Stage: ",7);
  pGVar2 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  sVar3 = strlen(pGVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," type: ",7);
  pGVar2 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type);
  if (pGVar2 == (GLchar *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(_func_int **)(local_1a0._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(pGVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pGVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", direction: ",0xd);
  pcVar4 = "output";
  if ((ulong)ptVar1[test_case_index].m_is_input != 0) {
    pcVar4 = "input";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,pcVar4,6 - (ulong)ptVar1[test_case_index].m_is_input);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", component: ",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingComponentWithoutLocationTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << " type: " << test_case.m_type.GetGLSLTypeName() << ", direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	stream << ", component: " << test_case.m_component;

	return stream.str();
}